

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emacs.c
# Opt level: O0

el_action_t em_kill_region(EditLine *el,wint_t c)

{
  wchar_t *local_30;
  wchar_t *cp;
  wchar_t *kp;
  wint_t c_local;
  EditLine *el_local;
  
  if ((el->el_chared).c_kill.mark == (wchar_t *)0x0) {
    el_local._7_1_ = '\x06';
  }
  else {
    if ((el->el_line).cursor < (el->el_chared).c_kill.mark) {
      local_30 = (el->el_line).cursor;
      cp = (el->el_chared).c_kill.buf;
      while (local_30 < (el->el_chared).c_kill.mark) {
        *cp = *local_30;
        local_30 = local_30 + 1;
        cp = cp + 1;
      }
      (el->el_chared).c_kill.last = cp;
      c_delafter(el,(wchar_t)((long)local_30 - (long)(el->el_line).cursor >> 2));
    }
    else {
      local_30 = (el->el_chared).c_kill.mark;
      cp = (el->el_chared).c_kill.buf;
      while (local_30 < (el->el_line).cursor) {
        *cp = *local_30;
        local_30 = local_30 + 1;
        cp = cp + 1;
      }
      (el->el_chared).c_kill.last = cp;
      c_delbefore(el,(wchar_t)((long)local_30 - (long)(el->el_chared).c_kill.mark >> 2));
      (el->el_line).cursor = (el->el_chared).c_kill.mark;
    }
    el_local._7_1_ = '\x04';
  }
  return el_local._7_1_;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
em_kill_region(EditLine *el, wint_t c __attribute__((__unused__)))
{
	wchar_t *kp, *cp;

	if (!el->el_chared.c_kill.mark)
		return CC_ERROR;

	if (el->el_chared.c_kill.mark > el->el_line.cursor) {
		cp = el->el_line.cursor;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_chared.c_kill.mark)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delafter(el, (int)(cp - el->el_line.cursor));
	} else {		/* mark is before cursor */
		cp = el->el_chared.c_kill.mark;
		kp = el->el_chared.c_kill.buf;
		while (cp < el->el_line.cursor)
			*kp++ = *cp++;	/* copy it */
		el->el_chared.c_kill.last = kp;
		c_delbefore(el, (int)(cp - el->el_chared.c_kill.mark));
		el->el_line.cursor = el->el_chared.c_kill.mark;
	}
	return CC_REFRESH;
}